

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sVertexArrayTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Stress::anon_unknown_1::SingleVertexArrayUsageTests::init
          (SingleVertexArrayUsageTests *this,EVP_PKEY_CTX *ctx)

{
  InputType type;
  Usage usage_;
  TestContext *testCtx;
  GLValue min_;
  GLValue max_;
  int iVar1;
  MultiVertexArrayTest *this_00;
  RenderContext *renderCtx;
  char *name_00;
  char *desc;
  GLValue GVar2;
  GLValue GVar3;
  InputType local_11c;
  undefined1 local_110 [8];
  string name;
  undefined1 local_e0 [8];
  Spec spec;
  undefined4 uStack_a4;
  undefined1 local_98 [8];
  ArraySpec arraySpec;
  bool aligned;
  int stride;
  int componentCount;
  int usageNdx;
  int strideNdx;
  int countNdx;
  int inputTypeNdx;
  InputType inputTypes [4];
  int strides [1];
  int counts [2];
  Usage usages [3];
  SingleVertexArrayUsageTests *this_local;
  
  counts[0] = 1;
  counts[1] = 2;
  stack0xffffffffffffffdc = 0x10000000001;
  inputTypes[2] = 0x11;
  _countNdx = 0x100000000;
  inputTypes[0] = INPUTTYPE_SHORT;
  inputTypes[1] = INPUTTYPE_BYTE;
  strideNdx = 0;
  iVar1 = 4;
  while (strideNdx < 4) {
    for (usageNdx = 0; usageNdx < 2; usageNdx = usageNdx + 1) {
      for (componentCount = 0; componentCount < 1; componentCount = componentCount + 1) {
        for (stride = 0; stride < 3; stride = stride + 1) {
          if ((int)inputTypes[(long)componentCount + 2] < 0) {
            iVar1 = deqp::gls::Array::inputTypeSize((&countNdx)[strideNdx]);
            local_11c = iVar1 << 1;
          }
          else {
            local_11c = inputTypes[(long)componentCount + 2];
          }
          iVar1 = deqp::gls::Array::inputTypeSize((&countNdx)[strideNdx]);
          arraySpec.max.field_1._7_1_ = (int)local_11c % iVar1 == 0;
          type = (&countNdx)[strideNdx];
          usage_ = counts[stride];
          GVar2 = deqp::gls::GLValue::getMinValue(type);
          GVar3 = deqp::gls::GLValue::getMaxValue((&countNdx)[strideNdx]);
          spec.arrays.
          super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = GVar3.type;
          max_._4_4_ = spec.arrays.
                       super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          max_.type = (InputType)
                      spec.arrays.
                      super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
          min_._4_4_ = uStack_a4;
          min_.type = GVar2.type;
          min_.field_1 = GVar2.field_1;
          max_.field_1 = GVar3.field_1;
          deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                    ((ArraySpec *)local_98,type,OUTPUTTYPE_VEC2,STORAGE_BUFFER,usage_,2,0,local_11c,
                     false,min_,max_);
          deqp::gls::MultiVertexArrayTest::Spec::Spec((Spec *)local_e0);
          local_e0._0_4_ = PRIMITIVE_TRIANGLES;
          local_e0._4_4_ = inputTypes[(long)usageNdx + 3];
          spec.primitive = PRIMITIVE_POINTS;
          std::
          vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ::push_back((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                       *)&spec.first,(ArraySpec *)local_98);
          deqp::gls::MultiVertexArrayTest::Spec::getName_abi_cxx11_
                    ((string *)local_110,(Spec *)local_e0);
          if ((arraySpec.max.field_1._7_1_ & 1) == 0) {
            this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
            testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
            renderCtx = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
            name_00 = (char *)std::__cxx11::string::c_str();
            desc = (char *)std::__cxx11::string::c_str();
            deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                      (this_00,testCtx,renderCtx,(Spec *)local_e0,name_00,desc);
            tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
          }
          std::__cxx11::string::~string((string *)local_110);
          deqp::gls::MultiVertexArrayTest::Spec::~Spec((Spec *)local_e0);
        }
      }
    }
    strideNdx = strideNdx + 1;
    iVar1 = strideNdx;
  }
  return iVar1;
}

Assistant:

void SingleVertexArrayUsageTests::init (void)
{
	// Test usage
	Array::Usage		usages[]		= {Array::USAGE_STATIC_DRAW, Array::USAGE_STREAM_DRAW, Array::USAGE_DYNAMIC_DRAW};
	int					counts[]		= {1, 256};
	int					strides[]		= {17};
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_FIXED, Array::INPUTTYPE_SHORT, Array::INPUTTYPE_BYTE};

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
		{
			for (int strideNdx = 0; strideNdx < DE_LENGTH_OF_ARRAY(strides); strideNdx++)
			{
				for (int usageNdx = 0; usageNdx < DE_LENGTH_OF_ARRAY(usages); usageNdx++)
				{
					const int	componentCount	= 2;
					const int	stride			= (strides[strideNdx] < 0 ? Array::inputTypeSize(inputTypes[inputTypeNdx]) * componentCount : strides[strideNdx]);
					const bool	aligned			= (stride % Array::inputTypeSize(inputTypes[inputTypeNdx])) == 0;
					MultiVertexArrayTest::Spec::ArraySpec arraySpec(inputTypes[inputTypeNdx],
																	Array::OUTPUTTYPE_VEC2,
																	Array::STORAGE_BUFFER,
																	usages[usageNdx],
																	componentCount,
																	0,
																	stride,
																	false,
																	GLValue::getMinValue(inputTypes[inputTypeNdx]),
																	GLValue::getMaxValue(inputTypes[inputTypeNdx]));

					MultiVertexArrayTest::Spec spec;
					spec.primitive	= Array::PRIMITIVE_TRIANGLES;
					spec.drawCount	= counts[countNdx];
					spec.first		= 0;
					spec.arrays.push_back(arraySpec);

					std::string name = spec.getName();

					if (!aligned)
						addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
				}
			}
		}
	}
}